

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * __thiscall
el::base::utils::OS::getEnvironmentVariable_abi_cxx11_
          (string *__return_storage_ptr__,OS *this,char *variableName,char *defaultVal,
          char *alternativeBashCommand)

{
  char *pcVar1;
  allocator *paVar2;
  allocator local_12;
  allocator local_11;
  
  pcVar1 = getenv((char *)this);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    paVar2 = &local_11;
  }
  else {
    paVar2 = &local_12;
    variableName = pcVar1;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,variableName,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string OS::getEnvironmentVariable(const char* variableName, const char* defaultVal,
                                       const char* alternativeBashCommand) {
#if ELPP_OS_UNIX
  const char* val = getenv(variableName);
#elif ELPP_OS_WINDOWS
  const char* val = getWindowsEnvironmentVariable(variableName);
#endif  // ELPP_OS_UNIX
  if ((val == nullptr) || ((strcmp(val, "") == 0))) {
#if ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
    // Try harder on unix-based systems
    std::string valBash = base::utils::OS::getBashOutput(alternativeBashCommand);
    if (valBash.empty()) {
      return std::string(defaultVal);
    } else {
      return valBash;
    }
#elif ELPP_OS_WINDOWS || ELPP_OS_UNIX
    ELPP_UNUSED(alternativeBashCommand);
    return std::string(defaultVal);
#endif  // ELPP_OS_UNIX && defined(ELPP_FORCE_ENV_VAR_FROM_BASH)
  }
  return std::string(val);
}